

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

void __thiscall
QItemSelectionModel::emitSelectionChanged
          (QItemSelectionModel *this,QItemSelection *newSelection,QItemSelection *oldSelection)

{
  compare_eq_result_container<QList<QItemSelectionRange>,_QItemSelectionRange> cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  QAbstractItemModel *pQVar5;
  qsizetype qVar6;
  ulong uVar7;
  QItemSelectionRange *lhs;
  int iVar8;
  long lVar9;
  QItemSelectionRange *rhs;
  int iVar10;
  QAbstractItemModel *pQVar11;
  long in_FS_OFFSET;
  ulong local_c0;
  QArrayDataPointer<QItemSelectionRange> local_a8;
  undefined1 local_88 [24];
  QArrayDataPointer<QItemSelectionRange> local_70;
  QItemSelectionRange local_58;
  QArrayDataPointer<QItemSelectionRange> *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((oldSelection->super_QList<QItemSelectionRange>).d.size != 0) ||
      ((newSelection->super_QList<QItemSelectionRange>).d.size != 0)) &&
     (cVar1 = QList<QItemSelectionRange>::operator==
                        (&oldSelection->super_QList<QItemSelectionRange>,
                         &newSelection->super_QList<QItemSelectionRange>), !cVar1)) {
    uVar4 = (oldSelection->super_QList<QItemSelectionRange>).d.size;
    if ((uVar4 == 0) ||
       (pQVar5 = (QAbstractItemModel *)(newSelection->super_QList<QItemSelectionRange>).d.size,
       pQVar5 == (QAbstractItemModel *)0x0)) {
      local_58.tl.d = (QPersistentModelIndexData *)0x0;
      local_58.br.d = (QPersistentModelIndexData *)newSelection;
      local_48 = (QArrayDataPointer<QItemSelectionRange> *)oldSelection;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
    }
    else {
      local_70.d = (oldSelection->super_QList<QItemSelectionRange>).d.d;
      local_70.ptr = (oldSelection->super_QList<QItemSelectionRange>).d.ptr;
      if (local_70.d != (Data *)0x0) {
        LOCK();
        ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar5 = (QAbstractItemModel *)(newSelection->super_QList<QItemSelectionRange>).d.size;
      }
      local_88._0_8_ = (newSelection->super_QList<QItemSelectionRange>).d.d;
      local_88._8_8_ = (newSelection->super_QList<QItemSelectionRange>).d.ptr;
      if ((Data *)local_88._0_8_ != (Data *)0x0) {
        LOCK();
        (((Data *)local_88._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (((Data *)local_88._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      local_88._16_8_ = pQVar5;
      local_70.size = uVar4;
      if (uVar4 == 0) {
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (QItemSelectionRange *)0x0;
        local_a8.size = 0;
      }
      else {
        lVar9 = 0;
        iVar8 = 0;
        do {
          iVar3 = 1;
          if (pQVar5 == (QAbstractItemModel *)0x0) {
            pQVar5 = (QAbstractItemModel *)0x0;
          }
          else {
            uVar4 = local_70.size;
            if (lVar9 < local_70.size) {
              iVar10 = 0;
              iVar3 = 1;
              qVar6 = 0;
              do {
                lhs = local_70.ptr + lVar9;
                rhs = (QItemSelectionRange *)(local_88._8_8_ + qVar6 * 0x10);
                bVar2 = ::comparesEqual(&lhs->tl,(QPersistentModelIndex *)rhs);
                if ((bVar2) && (bVar2 = ::comparesEqual(&lhs->br,&rhs->br), bVar2)) {
                  QList<QItemSelectionRange>::removeAt
                            ((QList<QItemSelectionRange> *)&local_70,lVar9);
                  QList<QItemSelectionRange>::removeAt((QList<QItemSelectionRange> *)local_88,qVar6)
                  ;
                  iVar3 = 0;
                }
                else {
                  iVar10 = iVar10 + 1;
                }
                qVar6 = (qsizetype)iVar10;
                uVar4 = local_70.size;
                pQVar5 = (QAbstractItemModel *)local_88._16_8_;
              } while ((qVar6 < (long)local_88._16_8_) && (lVar9 < local_70.size));
            }
          }
          iVar8 = iVar8 + iVar3 + 1;
          lVar9 = (long)iVar8;
        } while (lVar9 < (long)uVar4);
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (QItemSelectionRange *)0x0;
        local_a8.size = 0;
        pQVar5 = (QAbstractItemModel *)local_88._16_8_;
        if (uVar4 != 0) {
          uVar7 = 0;
          do {
            if (pQVar5 == (QAbstractItemModel *)0x0) {
              pQVar5 = (QAbstractItemModel *)0x0;
            }
            else {
              lVar9 = 0;
              pQVar11 = (QAbstractItemModel *)0x0;
              do {
                bVar2 = QItemSelectionRange::intersects
                                  (local_70.ptr + uVar7,
                                   (QItemSelectionRange *)
                                   ((long)&((QPersistentModelIndex *)local_88._8_8_)->d + lVar9));
                if (bVar2) {
                  QItemSelectionRange::intersected(&local_58,local_70.ptr + uVar7);
                  QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                            ((QMovableArrayOps<QItemSelectionRange> *)&local_a8,local_a8.size,
                             &local_58);
                  QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_a8);
                  QPersistentModelIndex::~QPersistentModelIndex(&local_58.br);
                  QPersistentModelIndex::~QPersistentModelIndex(&local_58.tl);
                }
                pQVar11 = (QAbstractItemModel *)((long)&(pQVar11->super_QObject)._vptr_QObject + 1);
                lVar9 = lVar9 + 0x10;
                uVar4 = local_70.size;
                pQVar5 = (QAbstractItemModel *)local_88._16_8_;
              } while (pQVar11 < (ulong)local_88._16_8_);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar4);
          pQVar5 = (QAbstractItemModel *)local_88._16_8_;
          if (local_a8.size != 0) {
            local_c0 = 0;
            do {
              if (local_70.size != 0) {
                qVar6 = 0;
                iVar8 = 0;
                do {
                  bVar2 = QItemSelectionRange::intersects
                                    (local_70.ptr + qVar6,local_a8.ptr + local_c0);
                  if (bVar2) {
                    QItemSelection::split
                              (local_70.ptr + qVar6,local_a8.ptr + local_c0,
                               (QItemSelection *)&local_70);
                    QList<QItemSelectionRange>::removeAt
                              ((QList<QItemSelectionRange> *)&local_70,qVar6);
                  }
                  else {
                    iVar8 = iVar8 + 1;
                  }
                  qVar6 = (qsizetype)iVar8;
                } while (qVar6 < local_70.size);
              }
              if ((QAbstractItemModel *)local_88._16_8_ == (QAbstractItemModel *)0x0) {
                pQVar5 = (QAbstractItemModel *)0x0;
              }
              else {
                qVar6 = 0;
                iVar8 = 0;
                do {
                  bVar2 = QItemSelectionRange::intersects
                                    ((QItemSelectionRange *)(local_88._8_8_ + qVar6 * 0x10),
                                     local_a8.ptr + local_c0);
                  if (bVar2) {
                    QItemSelection::split
                              ((QItemSelectionRange *)(local_88._8_8_ + qVar6 * 0x10),
                               local_a8.ptr + local_c0,(QItemSelection *)local_88);
                    QList<QItemSelectionRange>::removeAt
                              ((QList<QItemSelectionRange> *)local_88,qVar6);
                  }
                  else {
                    iVar8 = iVar8 + 1;
                  }
                  qVar6 = (qsizetype)iVar8;
                  pQVar5 = (QAbstractItemModel *)local_88._16_8_;
                } while (qVar6 < (long)local_88._16_8_);
              }
              local_c0 = local_c0 + 1;
            } while (local_c0 < (ulong)local_a8.size);
          }
        }
      }
      if ((pQVar5 != (QAbstractItemModel *)0x0) || (local_70.size != 0)) {
        local_58.tl.d = (QPersistentModelIndexData *)0x0;
        local_58.br.d = (QPersistentModelIndexData *)local_88;
        local_48 = &local_70;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
      }
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)local_88);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModel::emitSelectionChanged(const QItemSelection &newSelection,
                                               const QItemSelection &oldSelection)
{
    // if both selections are empty or equal we return
    if ((oldSelection.isEmpty() && newSelection.isEmpty()) ||
        oldSelection == newSelection)
        return;

    // if either selection is empty we do not need to compare
    if (oldSelection.isEmpty() || newSelection.isEmpty()) {
        emit selectionChanged(newSelection, oldSelection);
        return;
    }

    QItemSelection deselected = oldSelection;
    QItemSelection selected = newSelection;

    // remove equal ranges
    bool advance;
    for (int o = 0; o < deselected.size(); ++o) {
        advance = true;
        for (int s = 0; s < selected.size() && o < deselected.size();) {
            if (deselected.at(o) == selected.at(s)) {
                deselected.removeAt(o);
                selected.removeAt(s);
                advance = false;
            } else {
                ++s;
            }
        }
        if (advance)
            ++o;
    }

    // find intersections
    QItemSelection intersections;
    for (int o = 0; o < deselected.size(); ++o) {
        for (int s = 0; s < selected.size(); ++s) {
            if (deselected.at(o).intersects(selected.at(s)))
                intersections.append(deselected.at(o).intersected(selected.at(s)));
        }
    }

    // compare remaining ranges with intersections and split them to find deselected and selected
    for (int i = 0; i < intersections.size(); ++i) {
        // split deselected
        for (int o = 0; o < deselected.size();) {
            if (deselected.at(o).intersects(intersections.at(i))) {
                QItemSelection::split(deselected.at(o), intersections.at(i), &deselected);
                deselected.removeAt(o);
            } else {
                ++o;
            }
        }
        // split selected
        for (int s = 0; s < selected.size();) {
            if (selected.at(s).intersects(intersections.at(i))) {
                QItemSelection::split(selected.at(s), intersections.at(i), &selected);
                selected.removeAt(s);
            } else {
                ++s;
            }
        }
    }

    if (!selected.isEmpty() || !deselected.isEmpty())
        emit selectionChanged(selected, deselected);
}